

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_parse_transport(Curl_easy *data,char *transport)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  char *local_68;
  int off;
  int idx;
  uchar *rtp_channel_mask;
  char *p;
  curl_off_t chan;
  curl_off_t chan2;
  curl_off_t chan1;
  char *end;
  char *start;
  char *transport_local;
  Curl_easy *data_local;
  
  end = transport;
  start = transport;
  transport_local = (char *)data;
  while( true ) {
    bVar5 = false;
    if (end != (char *)0x0) {
      bVar5 = *end != '\0';
    }
    if (!bVar5) break;
    Curl_str_passblanks(&end);
    chan1 = (curl_off_t)strchr(end,0x3b);
    iVar2 = curl_strnequal(end,"interleaved=",0xc);
    if (iVar2 != 0) {
      rtp_channel_mask = (uchar *)(end + 0xc);
      iVar2 = Curl_str_number((char **)&rtp_channel_mask,&chan2,0xff);
      pcVar1 = transport_local;
      if (iVar2 == 0) {
        chan = chan2;
        iVar2 = Curl_str_single((char **)&rtp_channel_mask,'-');
        if ((iVar2 == 0) &&
           (iVar2 = Curl_str_number((char **)&rtp_channel_mask,&chan,0xff), iVar2 != 0)) {
          if (((transport_local != (char *)0x0) &&
              ((*(ulong *)(transport_local + 0xa2c) >> 0x1e & 1) != 0)) &&
             ((*(long *)(transport_local + 0x1310) == 0 ||
              (0 < *(int *)(*(long *)(transport_local + 0x1310) + 8))))) {
            Curl_infof((Curl_easy *)transport_local,
                       "Unable to read the interleaved parameter from Transport header: [%s]",start)
            ;
          }
          chan = chan2;
        }
        for (p = (char *)chan2; (long)p <= chan; p = p + 1) {
          uVar4 = (int)p >> 0x1f;
          lVar3 = (long)(int)((long)((ulong)uVar4 << 0x20 | (ulong)p & 0xffffffff) / 8);
          pcVar1[lVar3 + 0x11a8] =
               pcVar1[lVar3 + 0x11a8] |
               (byte)(1 << ((byte)((long)((ulong)uVar4 << 0x20 | (ulong)p & 0xffffffff) % 8) & 0x1f)
                     );
        }
      }
      else if (((transport_local != (char *)0x0) &&
               ((*(ulong *)(transport_local + 0xa2c) >> 0x1e & 1) != 0)) &&
              ((*(long *)(transport_local + 0x1310) == 0 ||
               (0 < *(int *)(*(long *)(transport_local + 0x1310) + 8))))) {
        Curl_infof((Curl_easy *)transport_local,
                   "Unable to read the interleaved parameter from Transport header: [%s]",start);
      }
      return CURLE_OK;
    }
    if (chan1 == 0) {
      local_68 = (char *)chan1;
    }
    else {
      local_68 = (char *)(chan1 + 1);
    }
    end = local_68;
  }
  return CURLE_OK;
}

Assistant:

static
CURLcode rtsp_parse_transport(struct Curl_easy *data, const char *transport)
{
  /* If we receive multiple Transport response-headers, the linterleaved
     channels of each response header is recorded and used together for
     subsequent data validity checks.*/
  /* e.g.: ' RTP/AVP/TCP;unicast;interleaved=5-6' */
  const char *start, *end;
  start = transport;
  while(start && *start) {
    Curl_str_passblanks(&start);
    end = strchr(start, ';');
    if(checkprefix("interleaved=", start)) {
      curl_off_t chan1, chan2, chan;
      const char *p = start + 12;
      if(!Curl_str_number(&p, &chan1, 255)) {
        unsigned char *rtp_channel_mask = data->state.rtp_channel_mask;
        chan2 = chan1;
        if(!Curl_str_single(&p, '-')) {
          if(Curl_str_number(&p, &chan2, 255)) {
            infof(data, "Unable to read the interleaved parameter from "
                  "Transport header: [%s]", transport);
            chan2 = chan1;
          }
        }
        for(chan = chan1; chan <= chan2; chan++) {
          int idx = (int)chan / 8;
          int off = (int)chan % 8;
          rtp_channel_mask[idx] |= (unsigned char)(1 << off);
        }
      }
      else {
        infof(data, "Unable to read the interleaved parameter from "
              "Transport header: [%s]", transport);
      }
      break;
    }
    /* skip to next parameter */
    start = (!end) ? end : (end + 1);
  }
  return CURLE_OK;
}